

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O2

void __thiscall
Rml::PropertySpecification::ParsePropertyValues
          (PropertySpecification *this,StringList *values_list,String *values,
          SplitOption split_option)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  byte bVar6;
  anon_class_16_2_d6396173 SubmitValue;
  String value;
  String local_50;
  
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  iVar2 = 0;
  uVar4 = 0;
  bVar6 = 0;
  SubmitValue.value = &value;
  SubmitValue.values_list = values_list;
  do {
    if (values->_M_string_length <= uVar4) {
      if (bVar6 == 0) {
        ParsePropertyValues::anon_class_16_2_d6396173::operator()(&SubmitValue);
      }
      ::std::__cxx11::string::~string((string *)&value);
      return;
    }
    if (bVar6 < 4) {
      bVar1 = (values->_M_dataplus)._M_p[uVar4];
      uVar3 = (ulong)bVar1;
      cVar5 = (char)&value;
      switch(bVar6) {
      case 0:
        if (bVar1 == 0x3b) {
          StringUtilities::StripWhitespace(&local_50,&value);
          ::std::__cxx11::string::operator=((string *)&value,(string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          bVar6 = 0;
          if (value._M_string_length != 0) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)values_list,&value);
            value._M_string_length = 0;
            *value._M_dataplus._M_p = '\0';
          }
        }
        else {
          if (split_option == Comma) {
            if (bVar1 == 0x22) goto LAB_002bb9fa;
            if (bVar1 == 0x28) {
LAB_002bbab9:
              ::std::__cxx11::string::push_back(cVar5);
              bVar6 = 1;
              iVar2 = 1;
              break;
            }
            if (bVar1 == 0x2c) {
LAB_002bba8e:
              ParsePropertyValues::anon_class_16_2_d6396173::operator()(&SubmitValue);
              goto LAB_002bbaed;
            }
          }
          else if (bVar1 < 0x29) {
            if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
              if (uVar3 == 0x22) {
                if (split_option != Whitespace) goto LAB_002bb9fa;
                ParsePropertyValues::anon_class_16_2_d6396173::operator()(&SubmitValue);
                bVar6 = 2;
                break;
              }
              if (uVar3 == 0x28) goto LAB_002bbab9;
            }
            else if (split_option != None) goto LAB_002bba8e;
          }
          ::std::__cxx11::string::push_back(cVar5);
LAB_002bbaed:
          bVar6 = 0;
        }
        break;
      case 1:
        if (bVar1 == 0x22) {
          bVar6 = 2;
        }
        else if (bVar1 == 0x29) {
          iVar2 = iVar2 + -1;
          bVar6 = iVar2 != 0;
        }
        else {
          if (bVar1 == 0x28) {
            iVar2 = iVar2 + 1;
          }
          bVar6 = 1;
        }
        ::std::__cxx11::string::push_back(cVar5);
        break;
      case 2:
        if (bVar1 == 0x5c) {
          bVar6 = 3;
        }
        else {
          if (bVar1 != 0x22) goto LAB_002bb9fa;
          if (iVar2 == 0) {
            if (split_option == Whitespace) {
              ParsePropertyValues::anon_class_16_2_d6396173::operator()(&SubmitValue);
            }
            else {
              ::std::__cxx11::string::push_back(cVar5);
            }
            iVar2 = 0;
            goto LAB_002bbaed;
          }
          ::std::__cxx11::string::push_back(cVar5);
          bVar6 = 1;
        }
        break;
      case 3:
        if ((bVar1 != 0x22) && (bVar1 != 0x5c)) {
          ::std::__cxx11::string::push_back(cVar5);
        }
LAB_002bb9fa:
        ::std::__cxx11::string::push_back(cVar5);
        bVar6 = 2;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void PropertySpecification::ParsePropertyValues(StringList& values_list, const String& values, const SplitOption split_option) const
{
	const bool split_values = (split_option != SplitOption::None);
	const bool split_by_comma = (split_option == SplitOption::Comma);
	const bool split_by_whitespace = (split_option == SplitOption::Whitespace);

	String value;

	auto SubmitValue = [&]() {
		value = StringUtilities::StripWhitespace(value);
		if (value.size() > 0)
		{
			values_list.push_back(value);
			value.clear();
		}
	};

	enum ParseState { VALUE, VALUE_PARENTHESIS, VALUE_QUOTE, VALUE_QUOTE_ESCAPE_NEXT };
	ParseState state = VALUE;
	int open_parentheses = 0;
	size_t character_index = 0;

	while (character_index < values.size())
	{
		const char character = values[character_index];
		character_index++;

		switch (state)
		{
		case VALUE:
		{
			if (character == ';')
			{
				value = StringUtilities::StripWhitespace(value);
				if (value.size() > 0)
				{
					values_list.push_back(value);
					value.clear();
				}
			}
			else if (split_by_comma ? (character == ',') : StringUtilities::IsWhitespace(character))
			{
				if (split_values)
					SubmitValue();
				else
					value += character;
			}
			else if (character == '"')
			{
				state = VALUE_QUOTE;
				if (split_by_whitespace)
					SubmitValue();
				else
					value += (split_by_comma ? '"' : ' ');
			}
			else if (character == '(')
			{
				open_parentheses = 1;
				value += character;
				state = VALUE_PARENTHESIS;
			}
			else
			{
				value += character;
			}
		}
		break;
		case VALUE_PARENTHESIS:
		{
			if (character == '(')
			{
				open_parentheses++;
			}
			else if (character == ')')
			{
				open_parentheses--;
				if (open_parentheses == 0)
					state = VALUE;
			}
			else if (character == '"')
			{
				state = VALUE_QUOTE;
			}

			value += character;
		}
		break;
		case VALUE_QUOTE:
		{
			if (character == '"')
			{
				if (open_parentheses == 0)
				{
					state = VALUE;
					if (split_by_whitespace)
						SubmitValue();
					else
						value += (split_by_comma ? '"' : ' ');
				}
				else
				{
					state = VALUE_PARENTHESIS;
					value += character;
				}
			}
			else if (character == '\\')
			{
				state = VALUE_QUOTE_ESCAPE_NEXT;
			}
			else
			{
				value += character;
			}
		}
		break;
		case VALUE_QUOTE_ESCAPE_NEXT:
		{
			if (character == '"' || character == '\\')
			{
				value += character;
			}
			else
			{
				value += '\\';
				value += character;
			}
			state = VALUE_QUOTE;
		}
		break;
		}
	}

	if (state == VALUE)
		SubmitValue();
}